

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus Decode3RImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  undefined8 in_RCX;
  MCInst *in_RDX;
  undefined4 in_ESI;
  MCInst *in_RDI;
  uint unaff_retaddr;
  DecodeStatus S;
  uint Op3;
  uint Op2;
  uint Op1;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint RegNo;
  undefined4 in_stack_fffffffffffffff0;
  
  RegNo = (uint)((ulong)in_RCX >> 0x20);
  DVar1 = Decode3OpInstruction
                    (unaff_retaddr,&in_RDI->OpcodePub,
                     (uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),&in_RDX->OpcodePub);
  if (DVar1 == MCDisassembler_Success) {
    MCOperand_CreateImm0(in_RDI,(ulong)in_stack_ffffffffffffffdc);
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (void *)CONCAT44(in_stack_ffffffffffffffd4,DVar1));
    DecodeGRRegsRegisterClass
              (in_RDX,RegNo,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               (void *)CONCAT44(in_stack_ffffffffffffffd4,DVar1));
  }
  return DVar1;
}

Assistant:

static DecodeStatus Decode3RImmInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S = Decode3OpInstruction(Insn, &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		MCOperand_CreateImm0(Inst, Op1);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	}

	return S;
}